

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

void __thiscall
vkt::wsi::anon_unknown_0::TriangleRenderer::~TriangleRenderer(TriangleRenderer *this)

{
  TriangleRenderer *this_local;
  
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::~vector(&this->m_framebuffers);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::~vector(&this->m_attachmentViews);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            (&this->m_vertexBufferMemory);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique(&this->m_vertexBuffer);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique(&this->m_pipeline);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique(&this->m_pipelineLayout);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique(&this->m_renderPass);
  std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
  ~vector(&this->m_swapchainImages);
  return;
}

Assistant:

TriangleRenderer::~TriangleRenderer (void)
{
}